

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

distance_t metric_soft_distance_linear(uint hard_x,uint8_t *soft_y,size_t len)

{
  uint uVar1;
  int local_2c;
  int d;
  uint soft_x;
  uint i;
  distance_t dist;
  size_t len_local;
  uint8_t *soft_y_local;
  uint hard_x_local;
  
  dist = 0;
  hard_x_local = hard_x;
  for (i = 0; i < len; i = i + 1) {
    uVar1 = hard_x_local & 1;
    hard_x_local = hard_x_local >> 1;
    local_2c = (uint)soft_y[i] - (-uVar1 & 0xff);
    if (local_2c < 0) {
      local_2c = -local_2c;
    }
    dist = dist + (short)local_2c;
  }
  return dist;
}

Assistant:

static inline distance_t metric_soft_distance_linear(unsigned int hard_x, const uint8_t *soft_y, size_t len) {
    distance_t dist = 0;
    for (unsigned int i = 0; i < len; i++) {
        unsigned int soft_x = ((int8_t)(0) - (hard_x & 1)) & 0xff;
        hard_x >>= 1;
        int d = soft_y[i] - soft_x;
        dist += (d < 0) ? -d : d;
    }
    return dist;
}